

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void do_cmd_roll_stats(command_conflict *cmd)

{
  char *pcVar1;
  int local_14;
  wchar_t i;
  command_conflict *cmd_local;
  
  save_roller_data(&prev);
  get_stats(stats);
  get_bonuses();
  get_ahw(player);
  if (player->history != (char *)0x0) {
    string_free(player->history);
  }
  pcVar1 = get_history(player->race->history);
  player->history = pcVar1;
  event_signal(EVENT_GOLD);
  event_signal(EVENT_AC);
  event_signal(EVENT_HP);
  event_signal(EVENT_STATS);
  points_left = L'\0';
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    points_spent[local_14] = 0;
    points_inc[local_14] = 0;
  }
  event_signal_birthpoints(points_spent,points_inc,points_left);
  rolled_stats = true;
  return;
}

Assistant:

void do_cmd_roll_stats(struct command *cmd)
{
	int i;

	save_roller_data(&prev);

	/* Get a new character */
	get_stats(stats);

	/* Update stats with bonuses, etc. */
	get_bonuses();

	/* There's no real need to do this here, but it's tradition. */
	get_ahw(player);
	if (player->history)
		string_free(player->history);
	player->history = get_history(player->race->history);

	event_signal(EVENT_GOLD);
	event_signal(EVENT_AC);
	event_signal(EVENT_HP);
	event_signal(EVENT_STATS);

	/* Give the UI some dummy info about the points situation. */
	points_left = 0;
	for (i = 0; i < STAT_MAX; i++) {
		points_spent[i] = 0;
		points_inc[i] = 0;
	}

	event_signal_birthpoints(points_spent, points_inc, points_left);

	/* Lock out buying and selling of stats based on rolled stats. */
	rolled_stats = true;
}